

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_test.cc
# Opt level: O1

bool ImportKey(FileTest *t,KeyMap *key_map,_func_EVP_PKEY_ptr_CBS_ptr *parse_func,
              _func_int_CBB_ptr_EVP_PKEY_ptr *marshal_func)

{
  _Head_base<0UL,_evp_pkey_st_*,_false> __p;
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *__dest;
  string *__k;
  const_iterator cVar4;
  __uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *this;
  pointer *__ptr;
  char *pcVar5;
  char *in_R9;
  pointer *__ptr_4;
  ulong uVar6;
  size_t __n;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__1;
  size_t len;
  UniquePtr<EVP_PKEY> pkey;
  size_t len_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  ScopedCBB cbb;
  vector<unsigned_char,_std::allocator<unsigned_char>_> input;
  string key_type;
  UniquePtr<uint8_t> free_der;
  uint8_t *der;
  size_t der_len;
  CBS cbs;
  undefined1 local_198 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  undefined1 local_178 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_170;
  pointer local_168;
  undefined1 local_158 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_130;
  Bytes local_128;
  size_type local_118;
  AssertHelper local_110;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  undefined1 local_e8 [16];
  anon_union_32_2_4f6aaa2e_for_u local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  undefined1 local_98 [32];
  string local_78;
  _Head_base<0UL,_unsigned_char_*,_false> local_58;
  AssertHelperData *local_50;
  pointer local_48;
  CBS local_40;
  
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8._0_8_ = &local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"Input","");
  bVar1 = FileTest::GetBytes(t,&local_b8,(string *)local_e8);
  if ((anon_union_32_2_4f6aaa2e_for_u *)local_e8._0_8_ != &local_d8) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_d8.base.buf + 1));
  }
  if (!bVar1) {
    bVar1 = false;
    goto LAB_00295573;
  }
  local_40.len = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
  local_40.data =
       local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_130._M_head_impl = (*parse_func)(&local_40);
  if ((EVP_PKEY *)local_130._M_head_impl == (EVP_PKEY *)0x0) {
    bVar1 = false;
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_e8._0_8_ = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"Type","");
    bVar1 = FileTest::GetAttribute(t,&local_78,(string *)local_e8);
    if ((anon_union_32_2_4f6aaa2e_for_u *)local_e8._0_8_ != &local_d8) {
      operator_delete((void *)local_e8._0_8_,(ulong)(local_d8.base.buf + 1));
    }
    if (bVar1) {
      iVar2 = std::__cxx11::string::compare((char *)&local_78);
      if (iVar2 == 0) {
        uVar3 = 6;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_78);
        if (iVar2 == 0) {
          uVar3 = 0x198;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_78);
          if (iVar2 == 0) {
            uVar3 = 0x74;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_78);
            if (iVar2 == 0) {
              uVar3 = 0x3b5;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_78);
              if (iVar2 == 0) {
                uVar3 = 0x3b4;
              }
              else {
                testing::Message::Message((Message *)local_198);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)((long)local_198 + 0x10),"Unknown key type: ",0x12);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)((long)local_198 + 0x10),local_78._M_dataplus._M_p,
                           local_78._M_string_length);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_98,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                           ,0x52,"Failed");
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_98,(Message *)local_198);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
                if (local_198 != (undefined1  [8])0x0) {
                  (**(code **)(*(size_type *)local_198 + 8))();
                }
                uVar3 = 0;
              }
            }
          }
        }
      }
      local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_108.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,uVar3);
      local_198._0_4_ = EVP_PKEY_id((EVP_PKEY *)local_130._M_head_impl);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_e8,"GetKeyType(t, key_type)","EVP_PKEY_id(pkey.get())",
                 (int *)&local_108,(int *)local_198);
      if (local_e8[0] == (string)0x0) {
        testing::Message::Message((Message *)local_198);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._8_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((_Alloc_hider *)local_e8._8_8_)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                   ,0x80,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_198);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
        if (local_198 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_198 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_e8 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_e8._8_8_);
      }
      CBB_zero((CBB *)local_e8);
      iVar2 = CBB_init((CBB *)local_e8,0);
      if (((iVar2 == 0) ||
          (iVar2 = (*marshal_func)((CBB *)local_e8,local_130._M_head_impl), iVar2 == 0)) ||
         (iVar2 = CBB_finish((CBB *)local_e8,(uint8_t **)&local_50,(size_t *)&local_48), iVar2 == 0)
         ) {
        bVar1 = false;
      }
      else {
        local_58._M_head_impl = (uchar *)local_50;
        local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar6 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        if (uVar6 == 0) {
          __dest = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        else {
          if ((long)uVar6 < 0) {
            std::__throw_bad_alloc();
          }
          __dest = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   operator_new(uVar6);
        }
        local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(__dest + uVar6);
        __n = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)__dest;
        if (__n != 0) {
          local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)__dest;
          memmove(__dest,local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,__n);
        }
        local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)(__dest + __n);
        local_198 = (undefined1  [8])&local_188;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"Output","");
        bVar1 = FileTest::HasAttribute(t,(string *)local_198);
        if (bVar1) {
          local_98._0_8_ = local_98 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"Output","");
          bVar1 = FileTest::GetBytes(t,&local_108,(string *)local_98);
          bVar1 = !bVar1;
          if ((AssertHelperData *)local_98._0_8_ != (AssertHelperData *)(local_98 + 0x10)) {
            operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
          }
        }
        else {
          bVar1 = false;
        }
        if (local_198 != (undefined1  [8])&local_188) {
          operator_delete((void *)local_198,local_188._M_allocated_capacity + 1);
        }
        if (bVar1) {
LAB_00294aab:
          bVar1 = false;
        }
        else {
          pbStack_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish +
                        -(long)local_108.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
          local_178 = (undefined1  [8])
                      local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_50;
          local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = local_48;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)local_198,"Bytes(output)","Bytes(der, der_len)",(Bytes *)local_178,
                     (Bytes *)&local_148);
          if (local_198[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_178);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)((long)local_178 + 0x10),"Re-encoding the key did not match.",0x22
                      );
            if (local_190 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = (local_190->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_148,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                       ,0x92,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_148,(Message *)local_178);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
            if (local_178 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_178 + 8))();
            }
          }
          if (local_190 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_190,local_190);
          }
          local_198 = (undefined1  [8])&local_188;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_198,"ExpectNoRawPrivate","");
          bVar1 = FileTest::HasAttribute(t,(string *)local_198);
          if (local_198 != (undefined1  [8])&local_188) {
            operator_delete((void *)local_198,local_188._M_allocated_capacity + 1);
          }
          if (!bVar1) {
            local_198 = (undefined1  [8])&local_188;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_198,"ExpectRawPrivate","");
            bVar1 = FileTest::HasAttribute(t,(string *)local_198);
            if (local_198 != (undefined1  [8])&local_188) {
              operator_delete((void *)local_198,local_188._M_allocated_capacity + 1);
            }
            if (!bVar1) goto LAB_00294fa8;
            local_178 = (undefined1  [8])0x0;
            pbStack_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_168 = (pointer)0x0;
            local_198 = (undefined1  [8])&local_188;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_198,"ExpectRawPrivate","");
            bVar1 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         local_178,(string *)local_198);
            if (local_198 != (undefined1  [8])&local_188) {
              operator_delete((void *)local_198,local_188._M_allocated_capacity + 1);
            }
            if (bVar1) {
              local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              iVar2 = EVP_PKEY_get_raw_private_key(local_130._M_head_impl,(uint8_t *)0x0,&local_118)
              ;
              if (iVar2 != 0) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_148,local_118);
                iVar2 = EVP_PKEY_get_raw_private_key
                                  (local_130._M_head_impl,
                                   local_148.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,&local_118);
                if (iVar2 != 0) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_148,local_118);
                  local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)local_148.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_148.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  local_158 = (undefined1  [8])
                              local_148.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                  local_128.span_.size_ = (long)pbStack_170 - (long)local_178;
                  local_128.span_.data_ = (uchar *)local_178;
                  testing::internal::CmpHelperEQ<Bytes,Bytes>
                            ((internal *)local_198,"Bytes(raw)","Bytes(expected)",(Bytes *)local_158
                             ,&local_128);
                  if (local_198[0] == (internal)0x0) {
                    testing::Message::Message((Message *)local_158);
                    if (local_190 ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar5 = "";
                    }
                    else {
                      pcVar5 = (local_190->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_128,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                               ,0xa8,pcVar5);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_128,(Message *)local_158);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
                    if (local_158 != (undefined1  [8])0x0) {
                      (**(code **)(*(long *)local_158 + 8))();
                    }
                  }
                  if (local_190 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_190,local_190);
                  }
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_148,local_118 - 1);
                  local_118 = (long)local_148.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_148.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                  iVar2 = EVP_PKEY_get_raw_private_key
                                    (local_130._M_head_impl,
                                     local_148.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,&local_118);
                  local_158[0] = iVar2 == 0;
                  local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                  if (iVar2 != 0) {
                    testing::Message::Message((Message *)&local_128);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_198,(internal *)local_158,
                               (AssertionResult *)
                               "EVP_PKEY_get_raw_private_key(pkey.get(), raw.data(), &len)","true",
                               "false",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_110,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                               ,0xad,(char *)local_198);
                    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_128);
                    testing::internal::AssertHelper::~AssertHelper(&local_110);
                    if (local_198 != (undefined1  [8])&local_188) {
                      operator_delete((void *)local_198,local_188._M_allocated_capacity + 1);
                    }
                    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_128.span_.data_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_128.span_.data_ + 8))();
                    }
                  }
                  if (local_150 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_150,local_150);
                  }
                  if ((AssertHelperData *)
                      local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != (AssertHelperData *)0x0) {
                    operator_delete(local_148.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_148.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_148.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       )local_178 !=
                      (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       )0x0) {
                    operator_delete((void *)local_178,(long)local_168 - (long)local_178);
                  }
                  goto LAB_00294fa8;
                }
              }
              goto LAB_00295233;
            }
LAB_0029524a:
            if (local_178 != (undefined1  [8])0x0) {
              operator_delete((void *)local_178,(long)local_168 - (long)local_178);
            }
            goto LAB_00294aab;
          }
          iVar2 = EVP_PKEY_get_raw_private_key
                            (local_130._M_head_impl,(uint8_t *)0x0,(size_t *)&local_148);
          local_178[0] = iVar2 == 0;
          pbStack_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar2 != 0) {
            testing::Message::Message((Message *)local_158);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_198,(internal *)local_178,
                       (AssertionResult *)"EVP_PKEY_get_raw_private_key(pkey.get(), nullptr, &len)",
                       "true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_128,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                       ,0x97,(char *)local_198);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_128,(Message *)local_158);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
            if (local_198 != (undefined1  [8])&local_188) {
              operator_delete((void *)local_198,local_188._M_allocated_capacity + 1);
            }
            if (local_158 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_158 + 8))();
            }
          }
          if (pbStack_170 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pbStack_170,pbStack_170);
          }
LAB_00294fa8:
          local_198 = (undefined1  [8])&local_188;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_198,"ExpectNoRawPublic","");
          bVar1 = FileTest::HasAttribute(t,(string *)local_198);
          if (local_198 != (undefined1  [8])&local_188) {
            operator_delete((void *)local_198,local_188._M_allocated_capacity + 1);
          }
          if (bVar1) {
            iVar2 = EVP_PKEY_get_raw_public_key
                              (local_130._M_head_impl,(uint8_t *)0x0,(size_t *)&local_148);
            local_178[0] = iVar2 == 0;
            pbStack_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar2 != 0) {
              testing::Message::Message((Message *)local_158);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_198,(internal *)local_178,
                         (AssertionResult *)"EVP_PKEY_get_raw_public_key(pkey.get(), nullptr, &len)"
                         ,"true","false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_128,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                         ,0xb2,(char *)local_198);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_128,(Message *)local_158);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
              if (local_198 != (undefined1  [8])&local_188) {
                operator_delete((void *)local_198,local_188._M_allocated_capacity + 1);
              }
              if (local_158 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)local_158 + 8))();
              }
            }
            if (pbStack_170 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_170,pbStack_170);
            }
          }
          else {
            local_198 = (undefined1  [8])&local_188;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_198,"ExpectRawPublic","");
            bVar1 = FileTest::HasAttribute(t,(string *)local_198);
            if (local_198 != (undefined1  [8])&local_188) {
              operator_delete((void *)local_198,local_188._M_allocated_capacity + 1);
            }
            if (bVar1) {
              local_178 = (undefined1  [8])0x0;
              pbStack_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
              ;
              local_168 = (pointer)0x0;
              local_198 = (undefined1  [8])&local_188;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_198,"ExpectRawPublic","");
              bVar1 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           local_178,(string *)local_198);
              if (local_198 != (undefined1  [8])&local_188) {
                operator_delete((void *)local_198,local_188._M_allocated_capacity + 1);
              }
              if (bVar1) {
                local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                iVar2 = EVP_PKEY_get_raw_public_key
                                  (local_130._M_head_impl,(uint8_t *)0x0,&local_118);
                if (iVar2 != 0) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_148,local_118);
                  iVar2 = EVP_PKEY_get_raw_public_key
                                    (local_130._M_head_impl,
                                     local_148.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,&local_118);
                  if (iVar2 != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_148,local_118);
                    local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)local_148.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_148.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
                    local_158 = (undefined1  [8])
                                local_148.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                    local_128.span_.size_ = (long)pbStack_170 - (long)local_178;
                    local_128.span_.data_ = (uchar *)local_178;
                    testing::internal::CmpHelperEQ<Bytes,Bytes>
                              ((internal *)local_198,"Bytes(raw)","Bytes(expected)",
                               (Bytes *)local_158,&local_128);
                    if (local_198[0] == (internal)0x0) {
                      testing::Message::Message((Message *)local_158);
                      if (local_190 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar5 = "";
                      }
                      else {
                        pcVar5 = (local_190->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_128,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                                 ,0xc3,pcVar5);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_128,(Message *)local_158);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
                      if (local_158 != (undefined1  [8])0x0) {
                        (**(code **)(*(long *)local_158 + 8))();
                      }
                    }
                    if (local_190 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_190,local_190);
                    }
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_148,local_118 - 1);
                    local_118 = (long)local_148.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_148.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                    iVar2 = EVP_PKEY_get_raw_public_key
                                      (local_130._M_head_impl,
                                       local_148.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,&local_118);
                    local_158[0] = iVar2 == 0;
                    local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0;
                    if (iVar2 != 0) {
                      testing::Message::Message((Message *)&local_128);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)local_198,(internal *)local_158,
                                 (AssertionResult *)
                                 "EVP_PKEY_get_raw_public_key(pkey.get(), raw.data(), &len)","true",
                                 "false",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_110,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                                 ,200,(char *)local_198);
                      testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_128);
                      testing::internal::AssertHelper::~AssertHelper(&local_110);
                      if (local_198 != (undefined1  [8])&local_188) {
                        operator_delete((void *)local_198,local_188._M_allocated_capacity + 1);
                      }
                      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )local_128.span_.data_ !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        (**(code **)(*(long *)local_128.span_.data_ + 8))();
                      }
                    }
                    if (local_150 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_150,local_150);
                    }
                    if ((AssertHelperData *)
                        local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start != (AssertHelperData *)0x0) {
                      operator_delete(local_148.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_148.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_148.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         )local_178 !=
                        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         )0x0) {
                      operator_delete((void *)local_178,(long)local_168 - (long)local_178);
                    }
                    goto LAB_002953ec;
                  }
                }
LAB_00295233:
                if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  operator_delete(local_148.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_148.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_148.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
              }
              goto LAB_0029524a;
            }
          }
LAB_002953ec:
          __k = FileTest::GetParameter_abi_cxx11_(t);
          local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((ulong)local_148.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
          cVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>_>_>
                  ::find(&key_map->_M_t,__k);
          local_178._1_7_ = 0;
          local_178[0] = (_Rb_tree_header *)cVar4._M_node !=
                         &(key_map->_M_t)._M_impl.super__Rb_tree_header;
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                    ((internal *)local_198,"0u","key_map->count(key_name)",(uint *)&local_148,
                     (unsigned_long *)local_178);
          if (local_198[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_178);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)((long)local_178 + 0x10),"Duplicate key: ",0xf);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)((long)local_178 + 0x10),(__k->_M_dataplus)._M_p,
                       __k->_M_string_length);
            if (local_190 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = (local_190->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_148,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                       ,0xcd,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_148,(Message *)local_178);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
            if (local_178 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_178 + 8))();
            }
          }
          if (local_190 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_190,local_190);
          }
          this = (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>_>_>
                 ::operator[](key_map,__k);
          __p._M_head_impl = local_130._M_head_impl;
          local_130._M_head_impl = (evp_pkey_st *)0x0;
          std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset(this,__p._M_head_impl);
          bVar1 = true;
        }
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete(local_108.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_108.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_58);
      }
      CBB_cleanup((CBB *)local_e8);
    }
    else {
      bVar1 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_130);
LAB_00295573:
  if (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

static bool ImportKey(FileTest *t, KeyMap *key_map,
                      EVP_PKEY *(*parse_func)(CBS *cbs),
                      int (*marshal_func)(CBB *cbb, const EVP_PKEY *key)) {
  std::vector<uint8_t> input;
  if (!t->GetBytes(&input, "Input")) {
    return false;
  }

  CBS cbs;
  CBS_init(&cbs, input.data(), input.size());
  bssl::UniquePtr<EVP_PKEY> pkey(parse_func(&cbs));
  if (!pkey) {
    return false;
  }

  std::string key_type;
  if (!t->GetAttribute(&key_type, "Type")) {
    return false;
  }
  EXPECT_EQ(GetKeyType(t, key_type), EVP_PKEY_id(pkey.get()));

  // The key must re-encode correctly.
  bssl::ScopedCBB cbb;
  uint8_t *der;
  size_t der_len;
  if (!CBB_init(cbb.get(), 0) ||
      !marshal_func(cbb.get(), pkey.get()) ||
      !CBB_finish(cbb.get(), &der, &der_len)) {
    return false;
  }
  bssl::UniquePtr<uint8_t> free_der(der);

  std::vector<uint8_t> output = input;
  if (t->HasAttribute("Output") &&
      !t->GetBytes(&output, "Output")) {
    return false;
  }
  EXPECT_EQ(Bytes(output), Bytes(der, der_len))
      << "Re-encoding the key did not match.";

  if (t->HasAttribute("ExpectNoRawPrivate")) {
    size_t len;
    EXPECT_FALSE(EVP_PKEY_get_raw_private_key(pkey.get(), nullptr, &len));
  } else if (t->HasAttribute("ExpectRawPrivate")) {
    std::vector<uint8_t> expected;
    if (!t->GetBytes(&expected, "ExpectRawPrivate")) {
      return false;
    }

    std::vector<uint8_t> raw;
    size_t len;
    if (!EVP_PKEY_get_raw_private_key(pkey.get(), nullptr, &len)) {
      return false;
    }
    raw.resize(len);
    if (!EVP_PKEY_get_raw_private_key(pkey.get(), raw.data(), &len)) {
      return false;
    }
    raw.resize(len);
    EXPECT_EQ(Bytes(raw), Bytes(expected));

    // Short buffers should be rejected.
    raw.resize(len - 1);
    len = raw.size();
    EXPECT_FALSE(EVP_PKEY_get_raw_private_key(pkey.get(), raw.data(), &len));
  }

  if (t->HasAttribute("ExpectNoRawPublic")) {
    size_t len;
    EXPECT_FALSE(EVP_PKEY_get_raw_public_key(pkey.get(), nullptr, &len));
  } else if (t->HasAttribute("ExpectRawPublic")) {
    std::vector<uint8_t> expected;
    if (!t->GetBytes(&expected, "ExpectRawPublic")) {
      return false;
    }

    std::vector<uint8_t> raw;
    size_t len;
    if (!EVP_PKEY_get_raw_public_key(pkey.get(), nullptr, &len)) {
      return false;
    }
    raw.resize(len);
    if (!EVP_PKEY_get_raw_public_key(pkey.get(), raw.data(), &len)) {
      return false;
    }
    raw.resize(len);
    EXPECT_EQ(Bytes(raw), Bytes(expected));

    // Short buffers should be rejected.
    raw.resize(len - 1);
    len = raw.size();
    EXPECT_FALSE(EVP_PKEY_get_raw_public_key(pkey.get(), raw.data(), &len));
  }

  // Save the key for future tests.
  const std::string &key_name = t->GetParameter();
  EXPECT_EQ(0u, key_map->count(key_name)) << "Duplicate key: " << key_name;
  (*key_map)[key_name] = std::move(pkey);
  return true;
}